

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgio.c
# Opt level: O0

int fd_recv(int sock,int *fds,size_t nfds)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int serrno;
  int ret;
  uint j;
  uint step;
  uint i;
  size_t nfds_local;
  int *fds_local;
  int sock_local;
  
  if ((nfds != 0) && (fds != (int *)0x0)) {
    j = 0;
    while( true ) {
      if (nfds <= j) {
        return 0;
      }
      if (nfds - j < 0x5e9) {
        ret = (int)nfds - j;
      }
      else {
        ret = 0x5e8;
      }
      iVar2 = fd_package_recv(sock,fds + j,(ulong)(uint)ret);
      if (iVar2 != 0) break;
      j = ret + j;
    }
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    for (serrno = 0; (uint)serrno < j; serrno = serrno + 1) {
      close(fds[(uint)serrno]);
    }
    piVar3 = __errno_location();
    *piVar3 = iVar1;
    return iVar2;
  }
  piVar3 = __errno_location();
  *piVar3 = 0x16;
  return -1;
}

Assistant:

int
fd_recv(int sock, int *fds, size_t nfds)
{
	unsigned int i, step, j;
	int ret, serrno;

	if (nfds == 0 || fds == NULL) {
		errno = EINVAL;
		return (-1);
	}

	ret = i = step = 0;
	while (i < nfds) {
		if (PKG_MAX_SIZE < nfds - i)
			step = PKG_MAX_SIZE;
		else
			step = nfds - i;
		ret = fd_package_recv(sock, fds + i, step);
		if (ret != 0) {
			/* Close all received descriptors. */
			serrno = errno;
			for (j = 0; j < i; j++)
				close(fds[j]);
			errno = serrno;
			break;
		}
		i += step;
	}

	return (ret);
}